

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitUnary(PrintExpressionContents *this,Unary *curr)

{
  long lVar1;
  ostream **ppoVar2;
  char *pcVar3;
  ostream *poVar4;
  
  poVar4 = this->o;
  ppoVar2 = &this->o;
  Colors::outputColorCode(poVar4,"\x1b[35m");
  Colors::outputColorCode(poVar4,"\x1b[1m");
  switch(curr->op) {
  case ClzInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.clz";
    goto LAB_00a312f0;
  case ClzInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.clz";
    goto LAB_00a312f0;
  case CtzInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.ctz";
    goto LAB_00a312f0;
  case CtzInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.ctz";
    goto LAB_00a312f0;
  case PopcntInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.popcnt";
    goto LAB_00a31134;
  case PopcntInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.popcnt";
    goto LAB_00a31134;
  case NegFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.neg";
    goto LAB_00a312f0;
  case NegFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.neg";
    goto LAB_00a312f0;
  case AbsFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.abs";
    goto LAB_00a312f0;
  case AbsFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.abs";
    goto LAB_00a312f0;
  case CeilFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.ceil";
    goto LAB_00a30de6;
  case CeilFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.ceil";
    goto LAB_00a30de6;
  case FloorFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.floor";
    break;
  case FloorFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.floor";
    break;
  case TruncFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.trunc";
    break;
  case TruncFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.trunc";
    break;
  case NearestFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.nearest";
    goto LAB_00a312b1;
  case NearestFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.nearest";
    goto LAB_00a312b1;
  case SqrtFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.sqrt";
    goto LAB_00a30de6;
  case SqrtFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.sqrt";
    goto LAB_00a30de6;
  case EqZInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.eqz";
    goto LAB_00a312f0;
  case EqZInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.eqz";
LAB_00a312f0:
    lVar1 = 7;
    goto LAB_00a312f5;
  case ExtendSInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend_i32_s";
    goto LAB_00a30d7e;
  case ExtendUInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend_i32_u";
LAB_00a30d7e:
    lVar1 = 0x10;
    goto LAB_00a312f5;
  case WrapInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.wrap_i64";
    goto LAB_00a30e44;
  case TruncSFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f32_s";
    goto LAB_00a312d3;
  case TruncSFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f32_s";
    goto LAB_00a312d3;
  case TruncUFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f32_u";
    goto LAB_00a312d3;
  case TruncUFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f32_u";
    goto LAB_00a312d3;
  case TruncSFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f64_s";
    goto LAB_00a312d3;
  case TruncSFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f64_s";
    goto LAB_00a312d3;
  case TruncUFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_f64_u";
    goto LAB_00a312d3;
  case TruncUFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_f64_u";
    goto LAB_00a312d3;
  case ReinterpretFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.reinterpret_f32";
    goto LAB_00a312c2;
  case ReinterpretFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.reinterpret_f64";
    goto LAB_00a312c2;
  case ConvertSInt32ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i32_s";
    goto LAB_00a3122b;
  case ConvertSInt32ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i32_s";
    goto LAB_00a3122b;
  case ConvertUInt32ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i32_u";
    goto LAB_00a3122b;
  case ConvertUInt32ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i32_u";
    goto LAB_00a3122b;
  case ConvertSInt64ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i64_s";
    goto LAB_00a3122b;
  case ConvertSInt64ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i64_s";
    goto LAB_00a3122b;
  case ConvertUInt64ToFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.convert_i64_u";
    goto LAB_00a3122b;
  case ConvertUInt64ToFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.convert_i64_u";
LAB_00a3122b:
    lVar1 = 0x11;
    goto LAB_00a312f5;
  case PromoteFloat32:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.promote_f32";
LAB_00a312d3:
    lVar1 = 0xf;
    goto LAB_00a312f5;
  case DemoteFloat64:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.demote_f64";
    goto LAB_00a3128f;
  case ReinterpretInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "f32.reinterpret_i32";
    goto LAB_00a312c2;
  case ReinterpretInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "f64.reinterpret_i64";
    goto LAB_00a312c2;
  case ExtendS8Int32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.extend8_s";
    goto LAB_00a312a0;
  case ExtendS16Int32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.extend16_s";
    goto LAB_00a3128f;
  case ExtendS8Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend8_s";
    goto LAB_00a312a0;
  case ExtendS16Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend16_s";
    goto LAB_00a3128f;
  case ExtendS32Int64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.extend32_s";
    goto LAB_00a3128f;
  case TruncSatSFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f32_s";
    goto LAB_00a312c2;
  case TruncSatUFloat32ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f32_u";
    goto LAB_00a312c2;
  case TruncSatSFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f64_s";
    goto LAB_00a312c2;
  case TruncSatUFloat64ToInt32:
    poVar4 = *ppoVar2;
    pcVar3 = "i32.trunc_sat_f64_u";
    goto LAB_00a312c2;
  case TruncSatSFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f32_s";
    goto LAB_00a312c2;
  case TruncSatUFloat32ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f32_u";
    goto LAB_00a312c2;
  case TruncSatSFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f64_s";
    goto LAB_00a312c2;
  case TruncSatUFloat64ToInt64:
    poVar4 = *ppoVar2;
    pcVar3 = "i64.trunc_sat_f64_u";
LAB_00a312c2:
    lVar1 = 0x13;
    goto LAB_00a312f5;
  case SplatVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.splat";
    goto LAB_00a312b1;
  case SplatVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.splat";
    goto LAB_00a312b1;
  case SplatVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.splat";
    goto LAB_00a312b1;
  case SplatVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.splat";
    goto LAB_00a312b1;
  case SplatVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.splat";
    goto LAB_00a312b1;
  case SplatVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.splat";
    goto LAB_00a312b1;
  case NotVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.not";
LAB_00a30de6:
    lVar1 = 8;
    goto LAB_00a312f5;
  case AnyTrueVec128:
    poVar4 = *ppoVar2;
    pcVar3 = "v128.any_true";
    goto LAB_00a312a0;
  case AbsVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.abs";
    break;
  case NegVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.neg";
    break;
  case AllTrueVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.all_true";
    goto LAB_00a3128f;
  case BitmaskVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.bitmask";
    goto LAB_00a312a0;
  case PopcntVecI8x16:
    poVar4 = *ppoVar2;
    pcVar3 = "i8x16.popcnt";
LAB_00a30e44:
    lVar1 = 0xc;
    goto LAB_00a312f5;
  case AbsVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.abs";
    break;
  case NegVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.neg";
    break;
  case AllTrueVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.all_true";
    goto LAB_00a3128f;
  case BitmaskVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.bitmask";
    goto LAB_00a312a0;
  case AbsVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.abs";
    break;
  case NegVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.neg";
    break;
  case AllTrueVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.all_true";
    goto LAB_00a3128f;
  case BitmaskVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.bitmask";
    goto LAB_00a312a0;
  case AbsVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.abs";
    break;
  case NegVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.neg";
    break;
  case AllTrueVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.all_true";
LAB_00a3128f:
    lVar1 = 0xe;
    goto LAB_00a312f5;
  case BitmaskVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.bitmask";
    goto LAB_00a312a0;
  case AbsVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.abs";
    break;
  case NegVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.neg";
    break;
  case SqrtVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.sqrt";
    goto LAB_00a31134;
  case CeilVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.ceil";
    goto LAB_00a31134;
  case FloorVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.floor";
    goto LAB_00a312b1;
  case TruncVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.trunc";
    goto LAB_00a312b1;
  case NearestVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.nearest";
    goto LAB_00a312a0;
  case AbsVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.abs";
    break;
  case NegVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.neg";
    break;
  case SqrtVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.sqrt";
    goto LAB_00a31134;
  case CeilVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.ceil";
    goto LAB_00a31134;
  case FloorVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.floor";
    goto LAB_00a312b1;
  case TruncVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.trunc";
    goto LAB_00a312b1;
  case NearestVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.nearest";
    goto LAB_00a312a0;
  case AbsVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.abs";
    break;
  case NegVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.neg";
    break;
  case SqrtVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.sqrt";
    goto LAB_00a31134;
  case CeilVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.ceil";
LAB_00a31134:
    lVar1 = 10;
    goto LAB_00a312f5;
  case FloorVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.floor";
    goto LAB_00a312b1;
  case TruncVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.trunc";
    goto LAB_00a312b1;
  case NearestVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.nearest";
LAB_00a312a0:
    lVar1 = 0xd;
    goto LAB_00a312f5;
  case ExtAddPairwiseSVecI8x16ToI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extadd_pairwise_i8x16_s";
    goto LAB_00a31102;
  case ExtAddPairwiseUVecI8x16ToI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extadd_pairwise_i8x16_u";
    goto LAB_00a31102;
  case ExtAddPairwiseSVecI16x8ToI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extadd_pairwise_i16x8_s";
    goto LAB_00a31102;
  case ExtAddPairwiseUVecI16x8ToI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extadd_pairwise_i16x8_u";
LAB_00a31102:
    lVar1 = 0x1d;
    goto LAB_00a312f5;
  case TruncSatSVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f32x4_s";
    goto LAB_00a31088;
  case TruncSatUVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f32x4_u";
    goto LAB_00a31088;
  case ConvertSVecI32x4ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.convert_i32x4_s";
    goto LAB_00a31060;
  case ConvertUVecI32x4ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.convert_i32x4_u";
    goto LAB_00a31060;
  case ExtendLowSVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_low_i8x16_s";
    goto LAB_00a30e21;
  case ExtendHighSVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_high_i8x16_s";
    goto LAB_00a31157;
  case ExtendLowUVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_low_i8x16_u";
    goto LAB_00a30e21;
  case ExtendHighUVecI8x16ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.extend_high_i8x16_u";
    goto LAB_00a31157;
  case ExtendLowSVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_low_i16x8_s";
    goto LAB_00a30e21;
  case ExtendHighSVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_high_i16x8_s";
    goto LAB_00a31157;
  case ExtendLowUVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_low_i16x8_u";
    goto LAB_00a30e21;
  case ExtendHighUVecI16x8ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.extend_high_i16x8_u";
    goto LAB_00a31157;
  case ExtendLowSVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_low_i32x4_s";
    goto LAB_00a30e21;
  case ExtendHighSVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_high_i32x4_s";
    goto LAB_00a31157;
  case ExtendLowUVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_low_i32x4_u";
LAB_00a30e21:
    lVar1 = 0x18;
    goto LAB_00a312f5;
  case ExtendHighUVecI32x4ToVecI64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "i64x2.extend_high_i32x4_u";
    goto LAB_00a31157;
  case ConvertLowSVecI32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.convert_low_i32x4_s";
    goto LAB_00a31157;
  case ConvertLowUVecI32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.convert_low_i32x4_u";
LAB_00a31157:
    lVar1 = 0x19;
    goto LAB_00a312f5;
  case TruncSatZeroSVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f64x2_s_zero";
    goto LAB_00a31074;
  case TruncSatZeroUVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.trunc_sat_f64x2_u_zero";
LAB_00a31074:
    lVar1 = 0x1c;
    goto LAB_00a312f5;
  case DemoteZeroVecF64x2ToVecF32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "f32x4.demote_f64x2_zero";
    goto LAB_00a31088;
  case PromoteLowVecF32x4ToVecF64x2:
    poVar4 = *ppoVar2;
    pcVar3 = "f64x2.promote_low_f32x4";
    goto LAB_00a31088;
  case RelaxedTruncSVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f32x4_s";
    goto LAB_00a3102e;
  case RelaxedTruncUVecF32x4ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f32x4_u";
LAB_00a3102e:
    lVar1 = 0x1b;
    goto LAB_00a312f5;
  case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f64x2_s_zero";
    goto LAB_00a30f75;
  case RelaxedTruncZeroUVecF64x2ToVecI32x4:
    poVar4 = *ppoVar2;
    pcVar3 = "i32x4.relaxed_trunc_f64x2_u_zero";
LAB_00a30f75:
    lVar1 = 0x20;
    goto LAB_00a312f5;
  case SplatVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.splat";
LAB_00a312b1:
    lVar1 = 0xb;
    goto LAB_00a312f5;
  case TruncSatSVecF16x8ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.trunc_sat_f16x8_s";
    goto LAB_00a31088;
  case TruncSatUVecF16x8ToVecI16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "i16x8.trunc_sat_f16x8_u";
LAB_00a31088:
    lVar1 = 0x17;
    goto LAB_00a312f5;
  case ConvertSVecI16x8ToVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.convert_i16x8_s";
    goto LAB_00a31060;
  case ConvertUVecI16x8ToVecF16x8:
    poVar4 = *ppoVar2;
    pcVar3 = "f16x8.convert_i16x8_u";
LAB_00a31060:
    lVar1 = 0x15;
    goto LAB_00a312f5;
  case InvalidUnary:
    handle_unreachable("unvalid unary operator",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x5a3);
  default:
    goto switchD_00a30a84_default;
  }
  lVar1 = 9;
LAB_00a312f5:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,lVar1);
switchD_00a30a84_default:
  Colors::outputColorCode(*ppoVar2,"\x1b[0m");
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    prepareColor(o);
    switch (curr->op) {
      case ClzInt32:
        o << "i32.clz";
        break;
      case CtzInt32:
        o << "i32.ctz";
        break;
      case PopcntInt32:
        o << "i32.popcnt";
        break;
      case EqZInt32:
        o << "i32.eqz";
        break;
      case ClzInt64:
        o << "i64.clz";
        break;
      case CtzInt64:
        o << "i64.ctz";
        break;
      case PopcntInt64:
        o << "i64.popcnt";
        break;
      case EqZInt64:
        o << "i64.eqz";
        break;
      case NegFloat32:
        o << "f32.neg";
        break;
      case AbsFloat32:
        o << "f32.abs";
        break;
      case CeilFloat32:
        o << "f32.ceil";
        break;
      case FloorFloat32:
        o << "f32.floor";
        break;
      case TruncFloat32:
        o << "f32.trunc";
        break;
      case NearestFloat32:
        o << "f32.nearest";
        break;
      case SqrtFloat32:
        o << "f32.sqrt";
        break;
      case NegFloat64:
        o << "f64.neg";
        break;
      case AbsFloat64:
        o << "f64.abs";
        break;
      case CeilFloat64:
        o << "f64.ceil";
        break;
      case FloorFloat64:
        o << "f64.floor";
        break;
      case TruncFloat64:
        o << "f64.trunc";
        break;
      case NearestFloat64:
        o << "f64.nearest";
        break;
      case SqrtFloat64:
        o << "f64.sqrt";
        break;
      case ExtendSInt32:
        o << "i64.extend_i32_s";
        break;
      case ExtendUInt32:
        o << "i64.extend_i32_u";
        break;
      case WrapInt64:
        o << "i32.wrap_i64";
        break;
      case TruncSFloat32ToInt32:
        o << "i32.trunc_f32_s";
        break;
      case TruncSFloat32ToInt64:
        o << "i64.trunc_f32_s";
        break;
      case TruncUFloat32ToInt32:
        o << "i32.trunc_f32_u";
        break;
      case TruncUFloat32ToInt64:
        o << "i64.trunc_f32_u";
        break;
      case TruncSFloat64ToInt32:
        o << "i32.trunc_f64_s";
        break;
      case TruncSFloat64ToInt64:
        o << "i64.trunc_f64_s";
        break;
      case TruncUFloat64ToInt32:
        o << "i32.trunc_f64_u";
        break;
      case TruncUFloat64ToInt64:
        o << "i64.trunc_f64_u";
        break;
      case ReinterpretFloat32:
        o << "i32.reinterpret_f32";
        break;
      case ReinterpretFloat64:
        o << "i64.reinterpret_f64";
        break;
      case ConvertUInt32ToFloat32:
        o << "f32.convert_i32_u";
        break;
      case ConvertUInt32ToFloat64:
        o << "f64.convert_i32_u";
        break;
      case ConvertSInt32ToFloat32:
        o << "f32.convert_i32_s";
        break;
      case ConvertSInt32ToFloat64:
        o << "f64.convert_i32_s";
        break;
      case ConvertUInt64ToFloat32:
        o << "f32.convert_i64_u";
        break;
      case ConvertUInt64ToFloat64:
        o << "f64.convert_i64_u";
        break;
      case ConvertSInt64ToFloat32:
        o << "f32.convert_i64_s";
        break;
      case ConvertSInt64ToFloat64:
        o << "f64.convert_i64_s";
        break;
      case PromoteFloat32:
        o << "f64.promote_f32";
        break;
      case DemoteFloat64:
        o << "f32.demote_f64";
        break;
      case ReinterpretInt32:
        o << "f32.reinterpret_i32";
        break;
      case ReinterpretInt64:
        o << "f64.reinterpret_i64";
        break;
      case ExtendS8Int32:
        o << "i32.extend8_s";
        break;
      case ExtendS16Int32:
        o << "i32.extend16_s";
        break;
      case ExtendS8Int64:
        o << "i64.extend8_s";
        break;
      case ExtendS16Int64:
        o << "i64.extend16_s";
        break;
      case ExtendS32Int64:
        o << "i64.extend32_s";
        break;
      case TruncSatSFloat32ToInt32:
        o << "i32.trunc_sat_f32_s";
        break;
      case TruncSatUFloat32ToInt32:
        o << "i32.trunc_sat_f32_u";
        break;
      case TruncSatSFloat64ToInt32:
        o << "i32.trunc_sat_f64_s";
        break;
      case TruncSatUFloat64ToInt32:
        o << "i32.trunc_sat_f64_u";
        break;
      case TruncSatSFloat32ToInt64:
        o << "i64.trunc_sat_f32_s";
        break;
      case TruncSatUFloat32ToInt64:
        o << "i64.trunc_sat_f32_u";
        break;
      case TruncSatSFloat64ToInt64:
        o << "i64.trunc_sat_f64_s";
        break;
      case TruncSatUFloat64ToInt64:
        o << "i64.trunc_sat_f64_u";
        break;
      case SplatVecI8x16:
        o << "i8x16.splat";
        break;
      case SplatVecI16x8:
        o << "i16x8.splat";
        break;
      case SplatVecI32x4:
        o << "i32x4.splat";
        break;
      case SplatVecI64x2:
        o << "i64x2.splat";
        break;
      case SplatVecF16x8:
        o << "f16x8.splat";
        break;
      case SplatVecF32x4:
        o << "f32x4.splat";
        break;
      case SplatVecF64x2:
        o << "f64x2.splat";
        break;
      case NotVec128:
        o << "v128.not";
        break;
      case AnyTrueVec128:
        o << "v128.any_true";
        break;
      case AbsVecI8x16:
        o << "i8x16.abs";
        break;
      case NegVecI8x16:
        o << "i8x16.neg";
        break;
      case AllTrueVecI8x16:
        o << "i8x16.all_true";
        break;
      case BitmaskVecI8x16:
        o << "i8x16.bitmask";
        break;
      case PopcntVecI8x16:
        o << "i8x16.popcnt";
        break;
      case AbsVecI16x8:
        o << "i16x8.abs";
        break;
      case NegVecI16x8:
        o << "i16x8.neg";
        break;
      case AllTrueVecI16x8:
        o << "i16x8.all_true";
        break;
      case BitmaskVecI16x8:
        o << "i16x8.bitmask";
        break;
      case AbsVecI32x4:
        o << "i32x4.abs";
        break;
      case NegVecI32x4:
        o << "i32x4.neg";
        break;
      case AllTrueVecI32x4:
        o << "i32x4.all_true";
        break;
      case BitmaskVecI32x4:
        o << "i32x4.bitmask";
        break;
      case AbsVecI64x2:
        o << "i64x2.abs";
        break;
      case NegVecI64x2:
        o << "i64x2.neg";
        break;
      case AllTrueVecI64x2:
        o << "i64x2.all_true";
        break;
      case BitmaskVecI64x2:
        o << "i64x2.bitmask";
        break;
      case AbsVecF16x8:
        o << "f16x8.abs";
        break;
      case NegVecF16x8:
        o << "f16x8.neg";
        break;
      case SqrtVecF16x8:
        o << "f16x8.sqrt";
        break;
      case CeilVecF16x8:
        o << "f16x8.ceil";
        break;
      case FloorVecF16x8:
        o << "f16x8.floor";
        break;
      case TruncVecF16x8:
        o << "f16x8.trunc";
        break;
      case NearestVecF16x8:
        o << "f16x8.nearest";
        break;
      case AbsVecF32x4:
        o << "f32x4.abs";
        break;
      case NegVecF32x4:
        o << "f32x4.neg";
        break;
      case SqrtVecF32x4:
        o << "f32x4.sqrt";
        break;
      case CeilVecF32x4:
        o << "f32x4.ceil";
        break;
      case FloorVecF32x4:
        o << "f32x4.floor";
        break;
      case TruncVecF32x4:
        o << "f32x4.trunc";
        break;
      case NearestVecF32x4:
        o << "f32x4.nearest";
        break;
      case AbsVecF64x2:
        o << "f64x2.abs";
        break;
      case NegVecF64x2:
        o << "f64x2.neg";
        break;
      case SqrtVecF64x2:
        o << "f64x2.sqrt";
        break;
      case CeilVecF64x2:
        o << "f64x2.ceil";
        break;
      case FloorVecF64x2:
        o << "f64x2.floor";
        break;
      case TruncVecF64x2:
        o << "f64x2.trunc";
        break;
      case NearestVecF64x2:
        o << "f64x2.nearest";
        break;
      case ExtAddPairwiseSVecI8x16ToI16x8:
        o << "i16x8.extadd_pairwise_i8x16_s";
        break;
      case ExtAddPairwiseUVecI8x16ToI16x8:
        o << "i16x8.extadd_pairwise_i8x16_u";
        break;
      case ExtAddPairwiseSVecI16x8ToI32x4:
        o << "i32x4.extadd_pairwise_i16x8_s";
        break;
      case ExtAddPairwiseUVecI16x8ToI32x4:
        o << "i32x4.extadd_pairwise_i16x8_u";
        break;
      case TruncSatSVecF32x4ToVecI32x4:
        o << "i32x4.trunc_sat_f32x4_s";
        break;
      case TruncSatUVecF32x4ToVecI32x4:
        o << "i32x4.trunc_sat_f32x4_u";
        break;
      case ConvertSVecI32x4ToVecF32x4:
        o << "f32x4.convert_i32x4_s";
        break;
      case ConvertUVecI32x4ToVecF32x4:
        o << "f32x4.convert_i32x4_u";
        break;
      case ExtendLowSVecI8x16ToVecI16x8:
        o << "i16x8.extend_low_i8x16_s";
        break;
      case ExtendHighSVecI8x16ToVecI16x8:
        o << "i16x8.extend_high_i8x16_s";
        break;
      case ExtendLowUVecI8x16ToVecI16x8:
        o << "i16x8.extend_low_i8x16_u";
        break;
      case ExtendHighUVecI8x16ToVecI16x8:
        o << "i16x8.extend_high_i8x16_u";
        break;
      case ExtendLowSVecI16x8ToVecI32x4:
        o << "i32x4.extend_low_i16x8_s";
        break;
      case ExtendHighSVecI16x8ToVecI32x4:
        o << "i32x4.extend_high_i16x8_s";
        break;
      case ExtendLowUVecI16x8ToVecI32x4:
        o << "i32x4.extend_low_i16x8_u";
        break;
      case ExtendHighUVecI16x8ToVecI32x4:
        o << "i32x4.extend_high_i16x8_u";
        break;
      case ExtendLowSVecI32x4ToVecI64x2:
        o << "i64x2.extend_low_i32x4_s";
        break;
      case ExtendHighSVecI32x4ToVecI64x2:
        o << "i64x2.extend_high_i32x4_s";
        break;
      case ExtendLowUVecI32x4ToVecI64x2:
        o << "i64x2.extend_low_i32x4_u";
        break;
      case ExtendHighUVecI32x4ToVecI64x2:
        o << "i64x2.extend_high_i32x4_u";
        break;
      case ConvertLowSVecI32x4ToVecF64x2:
        o << "f64x2.convert_low_i32x4_s";
        break;
      case ConvertLowUVecI32x4ToVecF64x2:
        o << "f64x2.convert_low_i32x4_u";
        break;
      case TruncSatZeroSVecF64x2ToVecI32x4:
        o << "i32x4.trunc_sat_f64x2_s_zero";
        break;
      case TruncSatZeroUVecF64x2ToVecI32x4:
        o << "i32x4.trunc_sat_f64x2_u_zero";
        break;
      case DemoteZeroVecF64x2ToVecF32x4:
        o << "f32x4.demote_f64x2_zero";
        break;
      case PromoteLowVecF32x4ToVecF64x2:
        o << "f64x2.promote_low_f32x4";
        break;
      case RelaxedTruncSVecF32x4ToVecI32x4:
        o << "i32x4.relaxed_trunc_f32x4_s";
        break;
      case RelaxedTruncUVecF32x4ToVecI32x4:
        o << "i32x4.relaxed_trunc_f32x4_u";
        break;
      case RelaxedTruncZeroSVecF64x2ToVecI32x4:
        o << "i32x4.relaxed_trunc_f64x2_s_zero";
        break;
      case RelaxedTruncZeroUVecF64x2ToVecI32x4:
        o << "i32x4.relaxed_trunc_f64x2_u_zero";
        break;
      case TruncSatSVecF16x8ToVecI16x8:
        o << "i16x8.trunc_sat_f16x8_s";
        break;
      case TruncSatUVecF16x8ToVecI16x8:
        o << "i16x8.trunc_sat_f16x8_u";
        break;
      case ConvertSVecI16x8ToVecF16x8:
        o << "f16x8.convert_i16x8_s";
        break;
      case ConvertUVecI16x8ToVecF16x8:
        o << "f16x8.convert_i16x8_u";
        break;
      case InvalidUnary:
        WASM_UNREACHABLE("unvalid unary operator");
    }
    restoreNormalColor(o);
  }